

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int string_buffer_concat(StringBuffer *s,JSString *p,uint32_t from,uint32_t to)

{
  void *__src;
  int iVar1;
  ulong uVar2;
  uint c;
  uint len;
  ulong uVar3;
  
  len = to - from;
  if (to < from || len == 0) {
    return 0;
  }
  if ((p->field_0x7 & 0x80) == 0) {
    iVar1 = string_buffer_write8(s,(uint8_t *)((long)&p[1].header.ref_count + (ulong)from),len);
    return iVar1;
  }
  __src = (void *)((long)&p[1].header.ref_count + (ulong)from * 2);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)len) {
    uVar3 = (ulong)len;
  }
  c = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    c = c | *(ushort *)((long)__src + uVar2 * 2);
  }
  iVar1 = s->len + len;
  if (s->size < iVar1) {
    iVar1 = string_buffer_realloc(s,iVar1,c);
  }
  else {
    if ((s->is_wide_char != 0) || (c < 0x100)) goto LAB_00133743;
    iVar1 = string_buffer_widen(s,s->size);
  }
  if (iVar1 != 0) {
    return -1;
  }
LAB_00133743:
  if (s->is_wide_char == 0) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      *(undefined1 *)((long)&s->str[1].header.ref_count + (long)s->len + uVar2) =
           *(undefined1 *)((long)__src + uVar2 * 2);
    }
  }
  else {
    memcpy((void *)((long)&s->str[1].header.ref_count + (long)s->len * 2),__src,(long)(int)(len * 2)
          );
  }
  s->len = s->len + len;
  return 0;
}

Assistant:

static int string_buffer_concat(StringBuffer *s, const JSString *p,
                                uint32_t from, uint32_t to)
{
    if (to <= from)
        return 0;
    if (p->is_wide_char)
        return string_buffer_write16(s, p->u.str16 + from, to - from);
    else
        return string_buffer_write8(s, p->u.str8 + from, to - from);
}